

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReadBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_5c;
  int fVerbose;
  int c;
  int nArgcNew;
  char *pTemp;
  char *FileName;
  char **pArgvNew;
  FILE *pFile;
  Gia_Man_t *pAig;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_5c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (argc - globalUtilOptind == 1) {
        pcVar2 = argv[globalUtilOptind];
        for (_c = pcVar2; *_c != '\0'; _c = _c + 1) {
          if (*_c == '>') {
            *_c = '\\';
          }
        }
        __stream = fopen(pcVar2,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar2);
          pcVar2 = Extra_FileGetSimilarName
                             (pcVar2,".blif",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (pcVar2 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
          }
          Abc_Print(1,"\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          fclose(__stream);
          pNew = Abc_NtkHieCecTest(pcVar2,local_5c);
          Abc_FrameUpdateGia(pAbc,pNew);
          pAbc_local._4_4_ = 0;
        }
      }
      else {
        Abc_Print(-1,"There is no file name.\n");
        pAbc_local._4_4_ = 1;
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 != 0x76) break;
    local_5c = local_5c ^ 1;
  }
  Abc_Print(-2,"usage: &read_blif [-vh] <file>\n");
  Abc_Print(-2,"\t         a specialized reader for hierarchical BLIF files\n");
  Abc_Print(-2,"\t         (for general-purpose BLIFs, please use \"read_blif\")\n");
  pcVar2 = "no";
  if (local_5c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadBlif( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Abc_NtkHieCecTest( char * pFileName, int fVerbose );
    Gia_Man_t * pAig;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".blif", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    pAig = Abc_NtkHieCecTest( FileName, fVerbose );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_blif [-vh] <file>\n" );
    Abc_Print( -2, "\t         a specialized reader for hierarchical BLIF files\n" );
    Abc_Print( -2, "\t         (for general-purpose BLIFs, please use \"read_blif\")\n" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}